

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmListFileLexer_Token *pcVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  bool bVar6;
  string local_6f0 [32];
  ostringstream local_6d0 [8];
  ostringstream error;
  string local_558 [32];
  ostringstream local_538 [8];
  ostringstream error_3;
  long local_3c0;
  unsigned_long parenDepth;
  unsigned_long lastLine;
  ostringstream local_390 [8];
  ostringstream error_2;
  string local_218 [48];
  ostringstream local_1e8 [8];
  ostringstream error_1;
  cmListFileLexer_Token *token;
  long local_28;
  long line_local;
  char *name_local;
  cmListFileParser *this_local;
  
  local_28 = line;
  line_local = (long)name;
  name_local = (char *)this;
  memset(&token,0,0x40);
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)&token);
  cmListFileFunction::operator=(&this->Function,(cmListFileFunction *)&token);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&token);
  std::__cxx11::string::operator=((string *)&this->Function,(char *)line_local);
  (this->Function).super_cmCommandContext.Line = local_28;
  do {
    pcVar1 = cmListFileLexer_Scan(this->Lexer);
    bVar6 = false;
    if (pcVar1 != (cmListFileLexer_Token *)0x0) {
      bVar6 = pcVar1->type == cmListFileLexer_Token_Space;
    }
  } while (bVar6);
  if (pcVar1 == (cmListFileLexer_Token *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1e8);
    poVar2 = std::operator<<((ostream *)local_1e8,"Error in cmake code at\n");
    poVar2 = std::operator<<(poVar2,this->FileName);
    poVar2 = std::operator<<(poVar2,":");
    lVar3 = cmListFileLexer_GetCurrentLine(this->Lexer);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
    poVar2 = std::operator<<(poVar2,":\n");
    std::operator<<(poVar2,"Parse error.  Function missing opening \"(\".");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_218);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1e8);
  }
  else if (pcVar1->type == cmListFileLexer_Token_ParenLeft) {
    local_3c0 = 0;
    this->Separation = SeparationOkay;
    do {
      while( true ) {
        while( true ) {
          uVar5 = cmListFileLexer_GetCurrentLine(this->Lexer);
          pcVar1 = cmListFileLexer_Scan(this->Lexer);
          if (pcVar1 == (cmListFileLexer_Token *)0x0) {
            std::__cxx11::ostringstream::ostringstream(local_6d0);
            poVar2 = std::operator<<((ostream *)local_6d0,"Error in cmake code at\n");
            poVar2 = std::operator<<(poVar2,this->FileName);
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
            poVar2 = std::operator<<(poVar2,":\n");
            poVar2 = std::operator<<(poVar2,"Parse error.  Function missing ending \")\".  ");
            std::operator<<(poVar2,"End of file reached.");
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_6f0);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_6d0);
            goto LAB_006a30e2;
          }
          if ((pcVar1->type != cmListFileLexer_Token_Space) &&
             (pcVar1->type != cmListFileLexer_Token_Newline)) break;
          this->Separation = SeparationOkay;
        }
        if (pcVar1->type == cmListFileLexer_Token_ParenLeft) break;
        if (pcVar1->type == cmListFileLexer_Token_ParenRight) {
          if (local_3c0 == 0) {
            this_local._7_1_ = 1;
            goto LAB_006a30e2;
          }
          local_3c0 = local_3c0 + -1;
          this->Separation = SeparationOkay;
          bVar6 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar6) {
            this_local._7_1_ = 0;
            goto LAB_006a30e2;
          }
          this->Separation = SeparationWarning;
        }
        else if ((pcVar1->type == cmListFileLexer_Token_Identifier) ||
                (pcVar1->type == cmListFileLexer_Token_ArgumentUnquoted)) {
          bVar6 = AddArgument(this,pcVar1,Unquoted);
          if (!bVar6) {
            this_local._7_1_ = 0;
            goto LAB_006a30e2;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentQuoted) {
          bVar6 = AddArgument(this,pcVar1,Quoted);
          if (!bVar6) {
            this_local._7_1_ = 0;
            goto LAB_006a30e2;
          }
          this->Separation = SeparationWarning;
        }
        else if (pcVar1->type == cmListFileLexer_Token_ArgumentBracket) {
          bVar6 = AddArgument(this,pcVar1,Bracket);
          if (!bVar6) {
            this_local._7_1_ = 0;
            goto LAB_006a30e2;
          }
          this->Separation = SeparationError;
        }
        else {
          if (pcVar1->type != cmListFileLexer_Token_CommentBracket) {
            std::__cxx11::ostringstream::ostringstream(local_538);
            poVar2 = std::operator<<((ostream *)local_538,"Error in cmake code at\n");
            poVar2 = std::operator<<(poVar2,this->FileName);
            poVar2 = std::operator<<(poVar2,":");
            lVar3 = cmListFileLexer_GetCurrentLine(this->Lexer);
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
            poVar2 = std::operator<<(poVar2,":\n");
            poVar2 = std::operator<<(poVar2,"Parse error.  Function missing ending \")\".  ");
            poVar2 = std::operator<<(poVar2,"Instead found ");
            pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
            poVar2 = std::operator<<(poVar2,pcVar4);
            poVar2 = std::operator<<(poVar2," with text \"");
            poVar2 = std::operator<<(poVar2,pcVar1->text);
            std::operator<<(poVar2,"\".");
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_558);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream(local_538);
            goto LAB_006a30e2;
          }
          this->Separation = SeparationError;
        }
      }
      local_3c0 = local_3c0 + 1;
      this->Separation = SeparationOkay;
      bVar6 = AddArgument(this,pcVar1,Unquoted);
    } while (bVar6);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_390);
    poVar2 = std::operator<<((ostream *)local_390,"Error in cmake code at\n");
    poVar2 = std::operator<<(poVar2,this->FileName);
    poVar2 = std::operator<<(poVar2,":");
    lVar3 = cmListFileLexer_GetCurrentLine(this->Lexer);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"Parse error.  Expected \"(\", got ");
    pcVar4 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar1->type);
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2," with text \"");
    poVar2 = std::operator<<(poVar2,pcVar1->text);
    std::operator<<(poVar2,"\".");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar4,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string((string *)&lastLine);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_390);
  }
LAB_006a30e2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Inintialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while((token = cmListFileLexer_Scan(this->Lexer)) &&
        token->type == cmListFileLexer_Token_Space) {}
  if(!token)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Function missing opening \"(\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }
  if(token->type != cmListFileLexer_Token_ParenLeft)
    {
    std::ostringstream error;
    error << "Error in cmake code at\n" << this->FileName << ":"
          << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
          << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    cmSystemTools::Error(error.str().c_str());
    return false;
    }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while((lastLine = cmListFileLexer_GetCurrentLine(this->Lexer),
         token = cmListFileLexer_Scan(this->Lexer)))
    {
    if(token->type == cmListFileLexer_Token_Space ||
       token->type == cmListFileLexer_Token_Newline)
      {
      this->Separation = SeparationOkay;
      continue;
      }
    if(token->type == cmListFileLexer_Token_ParenLeft)
      {
      parenDepth++;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      }
    else if(token->type == cmListFileLexer_Token_ParenRight)
      {
      if (parenDepth == 0)
        {
        return true;
        }
      parenDepth--;
      this->Separation = SeparationOkay;
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_Identifier ||
            token->type == cmListFileLexer_Token_ArgumentUnquoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Unquoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentQuoted)
      {
      if(!this->AddArgument(token, cmListFileArgument::Quoted))
        {
        return false;
        }
      this->Separation = SeparationWarning;
      }
    else if(token->type == cmListFileLexer_Token_ArgumentBracket)
      {
      if(!this->AddArgument(token, cmListFileArgument::Bracket))
        {
        return false;
        }
      this->Separation = SeparationError;
      }
    else if(token->type == cmListFileLexer_Token_CommentBracket)
      {
      this->Separation = SeparationError;
      }
    else
      {
      // Error.
      std::ostringstream error;
      error << "Error in cmake code at\n" << this->FileName << ":"
            << cmListFileLexer_GetCurrentLine(this->Lexer) << ":\n"
            << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      cmSystemTools::Error(error.str().c_str());
      return false;
      }
    }

  std::ostringstream error;
  error << "Error in cmake code at\n"
        << this->FileName << ":" << lastLine << ":\n"
        << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  cmSystemTools::Error(error.str().c_str());

  return false;
}